

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O1

void __thiscall leveldb::Benchmark::PrintEnvironment(Benchmark *this)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  char *pcVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  Slice SVar5;
  Slice SVar6;
  ulong local_490;
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  string cache_size;
  string cpu_type;
  time_t now;
  char line [1000];
  
  fprintf(_stderr,"LevelDB:    version %d.%d\n",1,0x16);
  now = time((time_t *)0x0);
  pFVar3 = _stderr;
  pcVar2 = ctime(&now);
  fprintf(pFVar3,"Date:       %s",pcVar2);
  pFVar3 = fopen("/proc/cpuinfo","r");
  if (pFVar3 != (FILE *)0x0) {
    cpu_type._M_dataplus._M_p = (pointer)&cpu_type.field_2;
    cpu_type._M_string_length = 0;
    cpu_type.field_2._M_local_buf[0] = '\0';
    cache_size._M_dataplus._M_p = (pointer)&cache_size.field_2;
    cache_size._M_string_length = 0;
    local_490 = 0;
    cache_size.field_2._M_local_buf[0] = '\0';
    pcVar2 = fgets(line,1000,pFVar3);
    if (pcVar2 != (char *)0x0) {
      local_490 = 0;
      do {
        pcVar2 = strchr(line,0x3a);
        if (pcVar2 != (char *)0x0) {
          SVar5.size_ = extraout_RDX;
          SVar5.data_ = pcVar2 + ~(ulong)line;
          SVar5 = anon_unknown_0::TrimSpace((anon_unknown_0 *)line,SVar5);
          pcVar4 = (char *)strlen(pcVar2 + 1);
          SVar6.size_ = extraout_RDX_00;
          SVar6.data_ = pcVar4;
          SVar6 = anon_unknown_0::TrimSpace((anon_unknown_0 *)(pcVar2 + 1),SVar6);
          pcVar2 = SVar6.data_;
          if (SVar5.size_ == 10) {
            iVar1 = bcmp(SVar5.data_,"model name",10);
            if (iVar1 == 0) {
              local_480[0] = local_470;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_480,pcVar2,pcVar2 + SVar6.size_);
              std::__cxx11::string::operator=((string *)&cpu_type,(string *)local_480);
              if (local_480[0] != local_470) {
                operator_delete(local_480[0]);
              }
              local_490 = (ulong)((int)local_490 + 1);
            }
            else {
              iVar1 = bcmp(SVar5.data_,"cache size",10);
              if (iVar1 == 0) {
                local_480[0] = local_470;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_480,pcVar2,pcVar2 + SVar6.size_);
                std::__cxx11::string::operator=((string *)&cache_size,(string *)local_480);
                if (local_480[0] != local_470) {
                  operator_delete(local_480[0]);
                }
              }
            }
          }
        }
        pcVar2 = fgets(line,1000,pFVar3);
      } while (pcVar2 != (char *)0x0);
    }
    fclose(pFVar3);
    fprintf(_stderr,"CPU:        %d * %s\n",local_490,cpu_type._M_dataplus._M_p);
    fprintf(_stderr,"CPUCache:   %s\n",cache_size._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cache_size._M_dataplus._M_p != &cache_size.field_2) {
      operator_delete(cache_size._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cpu_type._M_dataplus._M_p != &cpu_type.field_2) {
      operator_delete(cpu_type._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void PrintEnvironment() {
    std::fprintf(stderr, "LevelDB:    version %d.%d\n", kMajorVersion,
                 kMinorVersion);

#if defined(__linux)
    time_t now = time(nullptr);
    std::fprintf(stderr, "Date:       %s",
                 ctime(&now));  // ctime() adds newline

    FILE* cpuinfo = std::fopen("/proc/cpuinfo", "r");
    if (cpuinfo != nullptr) {
      char line[1000];
      int num_cpus = 0;
      std::string cpu_type;
      std::string cache_size;
      while (fgets(line, sizeof(line), cpuinfo) != nullptr) {
        const char* sep = strchr(line, ':');
        if (sep == nullptr) {
          continue;
        }
        Slice key = TrimSpace(Slice(line, sep - 1 - line));
        Slice val = TrimSpace(Slice(sep + 1));
        if (key == "model name") {
          ++num_cpus;
          cpu_type = val.ToString();
        } else if (key == "cache size") {
          cache_size = val.ToString();
        }
      }
      std::fclose(cpuinfo);
      std::fprintf(stderr, "CPU:        %d * %s\n", num_cpus, cpu_type.c_str());
      std::fprintf(stderr, "CPUCache:   %s\n", cache_size.c_str());
    }
#endif
  }